

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O3

void VP8LConvertBGRAToRGBA4444_C(uint32_t *src,int num_pixels,uint8_t *dst)

{
  uint *puVar1;
  uint uVar2;
  
  if (0 < num_pixels) {
    puVar1 = src + num_pixels;
    do {
      uVar2 = *src;
      src = src + 1;
      *dst = (byte)(uVar2 >> 0xc) & 0xf | (byte)(uVar2 >> 0x10) & 0xf0;
      dst[1] = (byte)(uVar2 >> 0x1c) | (byte)uVar2 & 0xf0;
      dst = dst + 2;
    } while (src < puVar1);
  }
  return;
}

Assistant:

void VP8LConvertBGRAToRGBA4444_C(const uint32_t* WEBP_RESTRICT src,
                                 int num_pixels, uint8_t* WEBP_RESTRICT dst) {
  const uint32_t* const src_end = src + num_pixels;
  while (src < src_end) {
    const uint32_t argb = *src++;
    const uint8_t rg = ((argb >> 16) & 0xf0) | ((argb >> 12) & 0xf);
    const uint8_t ba = ((argb >>  0) & 0xf0) | ((argb >> 28) & 0xf);
#if (WEBP_SWAP_16BIT_CSP == 1)
    *dst++ = ba;
    *dst++ = rg;
#else
    *dst++ = rg;
    *dst++ = ba;
#endif
  }
}